

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Object.cc
# Opt level: O3

void __thiscall
Object::projectEdge2Edge(Object *this,Edge *src,Vector2d *obs,Edge *dst,HeapType *heap)

{
  iterator *this_00;
  Matrix<double,_3,_1,_0,_3,_1> *pMVar1;
  double dVar2;
  double dVar3;
  double dVar4;
  double dVar5;
  undefined1 *puVar6;
  _Deque_iterator<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_Eigen::Matrix<double,_3,_1,_0,_3,_1>_&,_Eigen::Matrix<double,_3,_1,_0,_3,_1>_*>
  *this_01;
  bool bVar7;
  bool bVar8;
  bool bVar9;
  int iVar10;
  int iVar11;
  uint uVar12;
  uint uVar13;
  PointerType ptr_1;
  _Elt_pointer pMVar14;
  reference pMVar15;
  reference pMVar16;
  _Elt_pointer pMVar17;
  undefined4 *puVar18;
  double *pdVar19;
  _Map_pointer ppMVar20;
  Edge *__range2;
  ulong uVar21;
  _Elt_pointer pMVar22;
  double *pdVar23;
  int iVar24;
  PointerType ptr_2;
  undefined4 uVar25;
  undefined4 uVar26;
  vector<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_std::allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
  tasks;
  Vector2d ept;
  Vector2d fpt;
  double e_ang;
  Vector2d dst_f;
  Vector2d dst_b;
  double *local_138;
  double *pdStack_130;
  long local_128;
  undefined1 local_118 [8];
  double dStack_110;
  undefined1 local_108 [8];
  double dStack_100;
  double local_f8;
  double local_f0;
  Matrix<double,_3,_1,_0,_3,_1> local_e8;
  undefined1 local_c8 [16];
  double local_b8 [2];
  _Deque_iterator<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_Eigen::Matrix<double,_3,_1,_0,_3,_1>_&,_Eigen::Matrix<double,_3,_1,_0,_3,_1>_*>
  *local_a0;
  DenseStorage<double,_2,_2,_1,_0> local_98;
  Vector3d local_88;
  double *local_70;
  Vector2d local_68;
  Vector2d local_58;
  Vector2d local_48;
  
  local_c8._8_8_ = local_c8._0_8_;
  local_c8._0_8_ = heap;
  pMVar17 = (src->
            super_deque<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_std::allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
            ).
            super__Deque_base<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_std::allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
            ._M_impl.super__Deque_impl_data._M_start._M_cur;
  dVar4 = (obs->super_PlainObjectBase<Eigen::Matrix<double,_2,_1,_0,_2,_1>_>).m_storage.m_data.array
          [0];
  dVar3 = (obs->super_PlainObjectBase<Eigen::Matrix<double,_2,_1,_0,_2,_1>_>).m_storage.m_data.array
          [1];
  dVar2 = (pMVar17->super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>).m_storage.m_data.
          array[1] - dVar3;
  unique0x1000071c = SUB84(dVar2,0);
  local_108 = (undefined1  [8])
              ((pMVar17->super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>).m_storage.
               m_data.array[0] - dVar4);
  unique0x10000720 = (int)((ulong)dVar2 >> 0x20);
  pMVar14 = (src->
            super_deque<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_std::allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
            ).
            super__Deque_base<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_std::allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
            ._M_impl.super__Deque_impl_data._M_finish._M_cur;
  if (pMVar14 ==
      (src->
      super_deque<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_std::allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
      ).
      super__Deque_base<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_std::allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
      ._M_impl.super__Deque_impl_data._M_finish._M_first) {
    ppMVar20 = (src->
               super_deque<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_std::allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
               ).
               super__Deque_base<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_std::allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
               ._M_impl.super__Deque_impl_data._M_finish._M_node;
    pMVar1 = ppMVar20[-1];
    dVar3 = pMVar1[0x14].super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.
            m_data.array[1] - dVar3;
    unique0x1000083c = SUB84(dVar3,0);
    local_118 = (undefined1  [8])
                (pMVar1[0x14].super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage
                 .m_data.array[0] - dVar4);
    unique0x10000840 = (int)((ulong)dVar3 >> 0x20);
    dVar2 = (pMVar17->super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>).m_storage.m_data
            .array[2];
    uVar25 = SUB84(dVar2,0);
    uVar26 = (undefined4)((ulong)dVar2 >> 0x20);
    pMVar14 = ppMVar20[-1] + 0x15;
  }
  else {
    dVar3 = pMVar14[-1].super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.
            m_data.array[1] - dVar3;
    unique0x10000740 = SUB84(dVar3,0);
    local_118 = (undefined1  [8])
                (pMVar14[-1].super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.
                 m_data.array[0] - dVar4);
    unique0x10000744 = (int)((ulong)dVar3 >> 0x20);
    dVar2 = (pMVar17->super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>).m_storage.m_data
            .array[2];
    uVar25 = SUB84(dVar2,0);
    uVar26 = (undefined4)((ulong)dVar2 >> 0x20);
  }
  this_00 = &(src->
             super_deque<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_std::allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
             ).
             super__Deque_base<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_std::allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
             ._M_impl.super__Deque_impl_data._M_start;
  local_f0 = (double)CONCAT44(uVar26,uVar25);
  local_f8 = pMVar14[-1].super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.
             m_data.array[2];
  local_b8[1] = local_b8[0];
  local_b8[0] = local_f8;
  bVar7 = Edge::angleInRange(dst,(double)CONCAT44(uVar26,uVar25));
  bVar8 = Edge::angleInRange(dst,local_b8[0]);
  ppMVar20 = (src->
             super_deque<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_std::allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
             ).
             super__Deque_base<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_std::allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
             ._M_impl.super__Deque_impl_data._M_finish._M_node;
  uVar21 = ((long)(src->
                  super_deque<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_std::allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
                  ).
                  super__Deque_base<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_std::allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
                  ._M_impl.super__Deque_impl_data._M_start._M_last -
            (long)(src->
                  super_deque<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_std::allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
                  ).
                  super__Deque_base<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_std::allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
                  ._M_impl.super__Deque_impl_data._M_start._M_cur >> 3) * -0x5555555555555555 +
           ((long)(src->
                  super_deque<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_std::allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
                  ).
                  super__Deque_base<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_std::allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
                  ._M_impl.super__Deque_impl_data._M_finish._M_cur -
            (long)(src->
                  super_deque<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_std::allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
                  ).
                  super__Deque_base<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_std::allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
                  ._M_impl.super__Deque_impl_data._M_finish._M_first >> 3) * -0x5555555555555555 +
           (((long)ppMVar20 -
             (long)(src->
                   super_deque<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_std::allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
                   ).
                   super__Deque_base<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_std::allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
                   ._M_impl.super__Deque_impl_data._M_start._M_node >> 3) + -1 +
           (ulong)(ppMVar20 == (_Map_pointer)0x0)) * 0x15;
  if (uVar21 < 3) {
    if (!bVar7 || !bVar8) goto LAB_00107c9d;
LAB_00107c26:
    local_128 = 0;
    pdStack_130 = (double *)0x0;
    local_138 = (double *)0x0;
    local_48.super_PlainObjectBase<Eigen::Matrix<double,_2,_1,_0,_2,_1>_>.m_storage.m_data.array[0]
         = (double)local_108;
    local_48.super_PlainObjectBase<Eigen::Matrix<double,_2,_1,_0,_2,_1>_>.m_storage.m_data.array[1]
         = dStack_100;
    local_58.super_PlainObjectBase<Eigen::Matrix<double,_2,_1,_0,_2,_1>_>.m_storage.m_data.array[0]
         = (double)local_118;
    local_58.super_PlainObjectBase<Eigen::Matrix<double,_2,_1,_0,_2,_1>_>.m_storage.m_data.array[1]
         = dStack_110;
    local_68.super_PlainObjectBase<Eigen::Matrix<double,_2,_1,_0,_2,_1>_>.m_storage.m_data.array[0]
         = (obs->super_PlainObjectBase<Eigen::Matrix<double,_2,_1,_0,_2,_1>_>).m_storage.m_data.
           array[0];
    local_68.super_PlainObjectBase<Eigen::Matrix<double,_2,_1,_0,_2,_1>_>.m_storage.m_data.array[1]
         = (obs->super_PlainObjectBase<Eigen::Matrix<double,_2,_1,_0,_2,_1>_>).m_storage.m_data.
           array[1];
    bVar7 = breakEdge(this,&local_48,&local_58,&local_68,dst,(HeapType *)local_c8._0_8_);
    if (bVar7) goto LAB_00108153;
LAB_00107c73:
    std::vector<Eigen::Matrix<double,3,1,0,3,1>,std::allocator<Eigen::Matrix<double,3,1,0,3,1>>>::
    emplace_back<double&,double&,double&>
              ((vector<Eigen::Matrix<double,3,1,0,3,1>,std::allocator<Eigen::Matrix<double,3,1,0,3,1>>>
                *)&local_138,(double *)local_108,(double *)(local_108 + 8),&local_f0);
    pdVar19 = &local_f8;
    pdVar23 = (double *)local_118;
    puVar6 = local_118;
LAB_00107cb5:
    bVar7 = true;
    std::vector<Eigen::Matrix<double,3,1,0,3,1>,std::allocator<Eigen::Matrix<double,3,1,0,3,1>>>::
    emplace_back<double&,double&,double&>
              ((vector<Eigen::Matrix<double,3,1,0,3,1>,std::allocator<Eigen::Matrix<double,3,1,0,3,1>>>
                *)&local_138,pdVar23,(double *)(puVar6 + 8),pdVar19);
  }
  else {
    pMVar15 = std::
              _Deque_iterator<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_Eigen::Matrix<double,_3,_1,_0,_3,_1>_&,_Eigen::Matrix<double,_3,_1,_0,_3,_1>_*>
              ::operator[](this_00,uVar21 >> 1);
    bVar9 = Edge::angleInRange(dst,(pMVar15->
                                   super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>).
                                   m_storage.m_data.array[2]);
    local_138 = (double *)0x0;
    pdStack_130 = (double *)0x0;
    local_128 = 0;
    if (bVar7 && bVar8) {
      if (bVar9) goto LAB_00107c26;
      goto LAB_00107c73;
    }
LAB_00107c9d:
    local_128 = 0;
    pdStack_130 = (double *)0x0;
    local_138 = (double *)0x0;
    puVar6 = local_108;
    if (bVar7) {
      pdVar19 = &local_f0;
      pdVar23 = (double *)local_108;
      goto LAB_00107cb5;
    }
    if (bVar8) {
      std::vector<Eigen::Matrix<double,3,1,0,3,1>,std::allocator<Eigen::Matrix<double,3,1,0,3,1>>>::
      emplace_back<double&,double&,double&>
                ((vector<Eigen::Matrix<double,3,1,0,3,1>,std::allocator<Eigen::Matrix<double,3,1,0,3,1>>>
                  *)&local_138,(double *)local_118,(double *)(local_118 + 8),&local_f8);
      bVar7 = false;
    }
    else {
      pMVar17 = (dst->
                super_deque<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_std::allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
                ).
                super__Deque_base<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_std::allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
                ._M_impl.super__Deque_impl_data._M_start._M_cur;
      dVar3 = (obs->super_PlainObjectBase<Eigen::Matrix<double,_2,_1,_0,_2,_1>_>).m_storage.m_data.
              array[0];
      dVar5 = (obs->super_PlainObjectBase<Eigen::Matrix<double,_2,_1,_0,_2,_1>_>).m_storage.m_data.
              array[1];
      dVar2 = (pMVar17->super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>).m_storage.
              m_data.array[0] - dVar3;
      dVar4 = (pMVar17->super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>).m_storage.
              m_data.array[1] - dVar5;
      uVar25 = SUB84(dVar4,0);
      uVar26 = (undefined4)((ulong)dVar4 >> 0x20);
      local_b8[1]._0_4_ = uVar25;
      local_b8[0] = dVar2;
      local_b8[1]._4_4_ = uVar26;
      local_e8.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.array
      [1]._0_4_ = uVar25;
      local_e8.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.array
      [0] = dVar2;
      local_e8.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.array
      [1]._4_4_ = uVar26;
      pMVar14 = (dst->
                super_deque<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_std::allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
                ).
                super__Deque_base<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_std::allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
                ._M_impl.super__Deque_impl_data._M_finish._M_cur;
      if (pMVar14 ==
          (dst->
          super_deque<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_std::allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
          ).
          super__Deque_base<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_std::allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
          ._M_impl.super__Deque_impl_data._M_finish._M_first) {
        pMVar14 = (dst->
                  super_deque<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_std::allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
                  ).
                  super__Deque_base<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_std::allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
                  ._M_impl.super__Deque_impl_data._M_finish._M_node[-1] + 0x15;
      }
      dVar3 = pMVar14[-1].super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.
              m_data.array[0] - dVar3;
      dVar5 = pMVar14[-1].super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.
              m_data.array[1] - dVar5;
      uVar25 = SUB84(dVar5,0);
      uVar26 = (undefined4)((ulong)dVar5 >> 0x20);
      local_c8._8_4_ = uVar25;
      local_c8._0_8_ = dVar3;
      local_c8._12_4_ = uVar26;
      local_98.m_data.array[1]._0_4_ = uVar25;
      local_98.m_data.array[0] = dVar3;
      local_98.m_data.array[1]._4_4_ = uVar26;
      uVar12 = Edge::rotatedBinarySearch
                         (src,(pMVar17->super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>
                              ).m_storage.m_data.array[2]);
      bVar7 = (int)uVar12 < 1;
      if (0 < (int)uVar12) {
        pMVar15 = std::
                  _Deque_iterator<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_Eigen::Matrix<double,_3,_1,_0,_3,_1>_&,_Eigen::Matrix<double,_3,_1,_0,_3,_1>_*>
                  ::operator[](this_00,(ulong)(uVar12 - 1));
        pMVar16 = std::
                  _Deque_iterator<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_Eigen::Matrix<double,_3,_1,_0,_3,_1>_&,_Eigen::Matrix<double,_3,_1,_0,_3,_1>_*>
                  ::operator[](this_00,(ulong)uVar12);
        getIntersection(&local_88,(Vector2d *)&local_e8,pMVar15,pMVar16,obs);
        dVar2 = local_88.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.
                m_data.array[0] -
                (obs->super_PlainObjectBase<Eigen::Matrix<double,_2,_1,_0,_2,_1>_>).m_storage.m_data
                .array[0];
        dVar3 = local_88.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.
                m_data.array[1] -
                (obs->super_PlainObjectBase<Eigen::Matrix<double,_2,_1,_0,_2,_1>_>).m_storage.m_data
                .array[1];
        if (SQRT(local_b8[1] * local_b8[1] + local_b8[0] * local_b8[0]) <
            SQRT(dVar3 * dVar3 + dVar2 * dVar2)) goto LAB_00108153;
      }
      pMVar17 = (dst->
                super_deque<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_std::allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
                ).
                super__Deque_base<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_std::allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
                ._M_impl.super__Deque_impl_data._M_finish._M_cur;
      if (pMVar17 ==
          (dst->
          super_deque<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_std::allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
          ).
          super__Deque_base<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_std::allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
          ._M_impl.super__Deque_impl_data._M_finish._M_first) {
        pMVar17 = (dst->
                  super_deque<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_std::allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
                  ).
                  super__Deque_base<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_std::allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
                  ._M_impl.super__Deque_impl_data._M_finish._M_node[-1] + 0x15;
      }
      uVar13 = Edge::rotatedBinarySearch
                         (src,pMVar17[-1].
                              super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage
                              .m_data.array[2]);
      if ((int)uVar13 < 1) {
        if ((int)uVar12 < 1) goto LAB_00108153;
        pdVar19 = &local_f8;
        pdVar23 = (double *)local_118;
        puVar6 = local_118;
      }
      else {
        pMVar15 = std::
                  _Deque_iterator<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_Eigen::Matrix<double,_3,_1,_0,_3,_1>_&,_Eigen::Matrix<double,_3,_1,_0,_3,_1>_*>
                  ::operator[](this_00,(ulong)(uVar13 - 1));
        pMVar16 = std::
                  _Deque_iterator<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_Eigen::Matrix<double,_3,_1,_0,_3,_1>_&,_Eigen::Matrix<double,_3,_1,_0,_3,_1>_*>
                  ::operator[](this_00,(ulong)uVar13);
        getIntersection(&local_88,(Vector2d *)&local_98,pMVar15,pMVar16,obs);
        dVar2 = local_88.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.
                m_data.array[0] -
                (obs->super_PlainObjectBase<Eigen::Matrix<double,_2,_1,_0,_2,_1>_>).m_storage.m_data
                .array[0];
        dVar3 = local_88.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.
                m_data.array[1] -
                (obs->super_PlainObjectBase<Eigen::Matrix<double,_2,_1,_0,_2,_1>_>).m_storage.m_data
                .array[1];
        if (SQRT((double)local_c8._8_8_ * (double)local_c8._8_8_ +
                 (double)local_c8._0_8_ * (double)local_c8._0_8_) <
            SQRT(dVar3 * dVar3 + dVar2 * dVar2)) goto LAB_00108153;
        if (0 < (int)uVar12) {
          dst->valid = false;
          goto LAB_00108153;
        }
        pdVar19 = &local_f0;
        pdVar23 = (double *)local_108;
        puVar6 = local_108;
      }
      std::vector<Eigen::Matrix<double,3,1,0,3,1>,std::allocator<Eigen::Matrix<double,3,1,0,3,1>>>::
      emplace_back<double&,double&,double&>
                ((vector<Eigen::Matrix<double,3,1,0,3,1>,std::allocator<Eigen::Matrix<double,3,1,0,3,1>>>
                  *)&local_138,pdVar23,(double *)(puVar6 + 8),pdVar19);
    }
  }
  local_70 = pdStack_130;
  if (local_138 != pdStack_130) {
    local_a0 = &(dst->
                super_deque<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_std::allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
                ).
                super__Deque_base<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_std::allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
                ._M_impl.super__Deque_impl_data._M_start;
    iVar24 = 0;
    pdVar19 = local_138;
    do {
      local_c8[0] = iVar24 == 0;
      local_98.m_data.array = *(plain_array<double,_2,_0,_16> *)pdVar19;
      local_b8 = *(double (*) [2])pdVar19;
      iVar10 = Edge::rotatedBinarySearch(dst,(*(double (*) [2])(pdVar19 + 2))[0]);
      this_01 = local_a0;
      if ((iVar24 == 0) && (iVar10 < 1)) {
        puVar18 = (undefined4 *)__cxa_allocate_exception(4);
        *puVar18 = 0;
        __cxa_throw(puVar18,&int::typeinfo,0);
      }
      if ((iVar24 != 0) && (iVar10 < 1)) break;
      local_e8.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.array.
      _0_16_ = ZEXT816(0);
      local_e8.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.array
      [2] = 0.0;
      pMVar15 = std::
                _Deque_iterator<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_Eigen::Matrix<double,_3,_1,_0,_3,_1>_&,_Eigen::Matrix<double,_3,_1,_0,_3,_1>_*>
                ::operator[](local_a0,(long)(iVar10 + -1));
      pMVar16 = std::
                _Deque_iterator<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_Eigen::Matrix<double,_3,_1,_0,_3,_1>_&,_Eigen::Matrix<double,_3,_1,_0,_3,_1>_*>
                ::operator[](this_01,(long)iVar10);
      getIntersection(&local_88,(Vector2d *)&local_98,pMVar15,pMVar16,obs);
      local_e8.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.array
      [2] = local_88.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.
            array[2];
      local_e8.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.array
      [1] = local_88.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.
            array[1];
      local_e8.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.array
      [0] = local_88.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.
            array[0];
      dVar2 = local_88.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data
              .array[0] -
              (obs->super_PlainObjectBase<Eigen::Matrix<double,_2,_1,_0,_2,_1>_>).m_storage.m_data.
              array[0];
      dVar3 = local_88.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data
              .array[1] -
              (obs->super_PlainObjectBase<Eigen::Matrix<double,_2,_1,_0,_2,_1>_>).m_storage.m_data.
              array[1];
      if (SQRT(dVar3 * dVar3 + dVar2 * dVar2) <=
          SQRT(local_b8[1] * local_b8[1] + local_b8[0] * local_b8[0])) break;
      bVar7 = (bool)(bVar7 & local_c8[0]);
      if (bVar7 == false) {
        if (0 < iVar10) {
          do {
            std::
            deque<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_std::allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
            ::pop_front(&dst->
                         super_deque<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_std::allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
                       );
            iVar10 = iVar10 + -1;
          } while (iVar10 != 0);
        }
        pMVar17 = (dst->
                  super_deque<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_std::allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
                  ).
                  super__Deque_base<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_std::allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
                  ._M_impl.super__Deque_impl_data._M_start._M_cur;
        if (pMVar17 ==
            (dst->
            super_deque<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_std::allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
            ).
            super__Deque_base<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_std::allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
            ._M_impl.super__Deque_impl_data._M_start._M_first) {
          std::
          deque<Eigen::Matrix<double,3,1,0,3,1>,std::allocator<Eigen::Matrix<double,3,1,0,3,1>>>::
          _M_push_front_aux<Eigen::Matrix<double,3,1,0,3,1>&>
                    ((deque<Eigen::Matrix<double,3,1,0,3,1>,std::allocator<Eigen::Matrix<double,3,1,0,3,1>>>
                      *)dst,&local_e8);
        }
        else {
          pMVar17[-1].super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.
          array[2] = local_e8.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage
                     .m_data.array[2];
          pMVar17[-1].super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.
          array[0] = local_e8.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage
                     .m_data.array[0];
          pMVar17[-1].super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.
          array[1] = local_e8.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage
                     .m_data.array[1];
          local_a0->_M_cur = local_a0->_M_cur + -1;
        }
      }
      else {
        ppMVar20 = (dst->
                   super_deque<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_std::allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
                   ).
                   super__Deque_base<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_std::allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
                   ._M_impl.super__Deque_impl_data._M_finish._M_node;
        iVar11 = (int)((ulong)((long)(dst->
                                     super_deque<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_std::allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
                                     ).
                                     super__Deque_base<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_std::allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
                                     ._M_impl.super__Deque_impl_data._M_start._M_last -
                              (long)(dst->
                                    super_deque<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_std::allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
                                    ).
                                    super__Deque_base<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_std::allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
                                    ._M_impl.super__Deque_impl_data._M_start._M_cur) >> 3) *
                 -0x55555555 +
                 (int)((ulong)((long)(dst->
                                     super_deque<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_std::allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
                                     ).
                                     super__Deque_base<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_std::allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
                                     ._M_impl.super__Deque_impl_data._M_finish._M_cur -
                              (long)(dst->
                                    super_deque<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_std::allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
                                    ).
                                    super__Deque_base<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_std::allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
                                    ._M_impl.super__Deque_impl_data._M_finish._M_first) >> 3) *
                 -0x55555555 +
                 ((int)((ulong)((long)ppMVar20 -
                               (long)(dst->
                                     super_deque<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_std::allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
                                     ).
                                     super__Deque_base<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_std::allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
                                     ._M_impl.super__Deque_impl_data._M_start._M_node) >> 3) + -1 +
                 (uint)(ppMVar20 == (_Map_pointer)0x0)) * 0x15;
        if (iVar10 < iVar11) {
          iVar10 = iVar10 - iVar11;
          do {
            std::
            deque<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_std::allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
            ::pop_back(&dst->
                        super_deque<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_std::allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
                      );
            iVar10 = iVar10 + 1;
          } while (iVar10 != 0);
        }
        std::deque<Eigen::Matrix<double,3,1,0,3,1>,std::allocator<Eigen::Matrix<double,3,1,0,3,1>>>
        ::emplace_back<Eigen::Matrix<double,3,1,0,3,1>&>
                  ((deque<Eigen::Matrix<double,3,1,0,3,1>,std::allocator<Eigen::Matrix<double,3,1,0,3,1>>>
                    *)dst,&local_e8);
      }
      pMVar17 = (dst->
                super_deque<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_std::allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
                ).
                super__Deque_base<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_std::allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
                ._M_impl.super__Deque_impl_data._M_start._M_cur;
      pMVar14 = (dst->
                super_deque<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_std::allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
                ).
                super__Deque_base<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_std::allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
                ._M_impl.super__Deque_impl_data._M_finish._M_cur;
      if (pMVar17 != pMVar14) {
        pMVar22 = (dst->
                  super_deque<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_std::allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
                  ).
                  super__Deque_base<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_std::allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
                  ._M_impl.super__Deque_impl_data._M_start._M_last;
        ppMVar20 = (dst->
                   super_deque<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_std::allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
                   ).
                   super__Deque_base<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_std::allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
                   ._M_impl.super__Deque_impl_data._M_start._M_node;
        dVar2 = dst->min_dist;
        do {
          dVar3 = (pMVar17->super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>).m_storage.
                  m_data.array[0] -
                  (obs->super_PlainObjectBase<Eigen::Matrix<double,_2,_1,_0,_2,_1>_>).m_storage.
                  m_data.array[0];
          dVar4 = (pMVar17->super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>).m_storage.
                  m_data.array[1] -
                  (obs->super_PlainObjectBase<Eigen::Matrix<double,_2,_1,_0,_2,_1>_>).m_storage.
                  m_data.array[1];
          dVar3 = SQRT(dVar4 * dVar4 + dVar3 * dVar3);
          if (dVar3 < dVar2) {
            dst->min_dist = dVar3;
            dVar2 = dVar3;
          }
          pMVar17 = pMVar17 + 1;
          if (pMVar17 == pMVar22) {
            pMVar17 = ppMVar20[1];
            ppMVar20 = ppMVar20 + 1;
            pMVar22 = pMVar17 + 0x15;
          }
        } while (pMVar17 != pMVar14);
      }
      iVar24 = iVar24 + 1;
      pdVar19 = pdVar19 + 3;
    } while (pdVar19 != local_70);
  }
LAB_00108153:
  if (local_138 != (double *)0x0) {
    operator_delete(local_138,local_128 - (long)local_138);
  }
  return;
}

Assistant:

void Object::projectEdge2Edge(const Edge& src, const Eigen::Vector2d& obs, Edge& dst, HeapType& heap) {
    bool pop_back_flag = true;
    Eigen::Vector2d fpt = src.front().block<2, 1>(0, 0) - obs, ept = src.back().block<2, 1>(0, 0) - obs;
    double f_ang = src.front().z(), e_ang = src.back().z();
    bool head_in_range = dst.angleInRange(f_ang), end_in_range = dst.angleInRange(e_ang), mid_in_range = true;
    if (src.size() > 2) {
        size_t mid_id = src.size() / 2;
        mid_in_range = dst.angleInRange(src[mid_id].z());
    }
    std::vector<Eigen::Vector3d> tasks;
    if (head_in_range && end_in_range) {        
        if (mid_in_range) {                     // 加edge 打断
            LOG_ERROR_STREAM("Breaking edge!");
            if (breakEdge(fpt, ept, obs, dst, heap) == true)
                return;
        }                          // 特殊情况
        tasks.emplace_back(fpt.x(), fpt.y(), f_ang);
        tasks.emplace_back(ept.x(), ept.y(), e_ang);
    } else if (head_in_range) {
        tasks.emplace_back(fpt.x(), fpt.y(), f_ang);
    } else if (end_in_range) {
        tasks.emplace_back(ept.x(), ept.y(), e_ang);
        pop_back_flag = false;          // pop_front
    } else {                            // SRC的两个端点不在DST范围内（有可能完全遮挡的）
        const Eigen::Vector2d dst_f = dst.front().block<2, 1>(0, 0) - obs, dst_b = dst.back().block<2, 1>(0, 0) - obs;
        int f_id = src.rotatedBinarySearch(dst.front().z());
        if (f_id > 0) {
            Eigen::Vector3d tmp;
            bool dst_closer = rangeSuitable(src[f_id - 1], src[f_id], dst_f, obs, tmp);
            if (dst_closer == true) return;
        }
        int e_id = src.rotatedBinarySearch(dst.back().z());
        if (e_id > 0) {
            Eigen::Vector3d tmp;
            bool dst_closer = rangeSuitable(src[e_id - 1], src[e_id], dst_b, obs, tmp);
            if (dst_closer == true) return;        // 投影边的range更大
        }
        if (f_id <= 0 && e_id <= 0) return;          // 反向光线
        if (f_id > 0 && e_id > 0) {
            dst.valid = false;
            return;
        }
        if (f_id > 0) {
            tasks.emplace_back(ept.x(), ept.y(), e_ang);
            pop_back_flag = false;          // pop_front
        } else {
            tasks.emplace_back(fpt.x(), fpt.y(), f_ang);
        }
    }
    int task_id = 0;
    for (const Eigen::Vector3d& task: tasks) {
        if (task_id > 0) pop_back_flag = false;
        double angle = task.z();
        Eigen::Vector2d beam = task.block<2, 1>(0, 0);
        int id = dst.rotatedBinarySearch(angle);
        if (task_id == 0 && id <= 0) {
            LOG_ERROR_STREAM("Task is 0 and id <= 0");
            throw 0;
        } else if (task_id > 0 && id <= 0) break;
        Eigen::Vector3d intersect = Eigen::Vector3d::Zero();
        if (rangeSuitable(dst[id - 1], dst[id], beam, obs, intersect) == false) {
            return;
        }
        if (pop_back_flag == true) {            // 删除大角度
            int delete_cnt = static_cast<int>(dst.size()) - id;
            for (int i = 0; i < delete_cnt; i++)
                dst.pop_back();
            dst.emplace_back(intersect);
        } else {
            for (int i = 0; i < id; i++) {
                dst.pop_front();
            }
            dst.emplace_front(intersect);
        }
        for (const Eigen::Vector3d& pt: dst) {
            double dist = (pt.block<2, 1>(0, 0) - obs).norm();
            if (dist < dst.min_dist) dst.min_dist = dist;
        }
        task_id ++;
    }
}